

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O3

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<4>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  Vec4 *pVVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long *plVar22;
  byte bVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  long *plVar27;
  ulong uVar28;
  long lVar29;
  long *plVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  deInt64 sy [4];
  Vector<long,_4> e20 [4];
  Vector<long,_4> e12 [4];
  Vector<long,_4> e01 [4];
  float local_2c8 [4];
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8 [44];
  long local_1f8 [4];
  long local_1d8 [2];
  int local_1c8;
  int iStack_1c4;
  long alStack_1c0 [44];
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  
  iVar3 = (this->m_curPos).m_data[1];
  iVar31 = (this->m_bboxMax).m_data[1];
  iVar36 = 0;
  if (0 < maxFragmentPackets && iVar3 <= iVar31) {
    fVar2 = (this->m_v2).m_data[2];
    fVar41 = (this->m_v0).m_data[2] - fVar2;
    fVar42 = (this->m_v1).m_data[2] - fVar2;
    iVar36 = 0;
    do {
      iVar4 = (this->m_curPos).m_data[0];
      iVar24 = iVar3 + 1;
      iVar26 = iVar4 + 1;
      local_1d8[0] = CONCAT44(-(uint)(iVar4 << 8 < 0),iVar4 << 8);
      _local_1c8 = CONCAT44(-(uint)(iVar26 * 0x100 < 0),iVar26 * 0x100);
      local_1f8[0] = (long)(iVar3 << 8);
      local_1f8[1] = (long)(iVar3 << 8);
      local_1f8[2] = (long)(iVar24 * 0x100);
      local_1f8[3] = (long)(iVar24 * 0x100);
      iVar18 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      iVar19 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
      res_2.m_data[2] = 0.0;
      res_2.m_data[3] = 0.0;
      alStack_1c0[0x2b] = 0;
      res_2.m_data[0] = 0.0;
      res_2.m_data[1] = 0.0;
      alStack_1c0[0x29] = 0;
      alStack_1c0[0x2a] = 0;
      alStack_1c0[0x27] = 0;
      alStack_1c0[0x28] = 0;
      alStack_1c0[0x25] = 0;
      alStack_1c0[0x26] = 0;
      alStack_1c0[0x23] = 0;
      alStack_1c0[0x24] = 0;
      alStack_1c0[0x21] = 0;
      alStack_1c0[0x22] = 0;
      alStack_1c0[0x1f] = 0;
      alStack_1c0[0x20] = 0;
      alStack_1c0[0x1d] = 0;
      alStack_1c0[0x1e] = 0;
      alStack_1c0[0x1b] = 0;
      alStack_1c0[0x1c] = 0;
      alStack_1c0[0x19] = 0;
      alStack_1c0[0x1a] = 0;
      alStack_1c0[0x17] = 0;
      alStack_1c0[0x18] = 0;
      alStack_1c0[0x15] = 0;
      alStack_1c0[0x16] = 0;
      alStack_1c0[0x13] = 0;
      alStack_1c0[0x14] = 0;
      alStack_1c0[0x11] = 0;
      alStack_1c0[0x12] = 0;
      alStack_1c0[0xf] = 0;
      alStack_1c0[0x10] = 0;
      alStack_1c0[0xd] = 0;
      alStack_1c0[0xe] = 0;
      alStack_1c0[0xb] = 0;
      alStack_1c0[0xc] = 0;
      alStack_1c0[9] = 0;
      alStack_1c0[10] = 0;
      alStack_1c0[7] = 0;
      alStack_1c0[8] = 0;
      alStack_1c0[5] = 0;
      alStack_1c0[6] = 0;
      alStack_1c0[3] = 0;
      alStack_1c0[4] = 0;
      alStack_1c0[1] = 0;
      alStack_1c0[2] = 0;
      lVar5 = (this->m_edge01).a;
      lVar6 = (this->m_edge01).b;
      lVar7 = (this->m_edge01).c;
      lVar8 = (this->m_edge12).a;
      lVar9 = (this->m_edge12).b;
      lVar10 = (this->m_edge12).c;
      lVar11 = (this->m_edge20).a;
      lVar12 = (this->m_edge20).b;
      lVar13 = (this->m_edge20).c;
      plVar22 = alStack_1c0 + 0x21;
      plVar27 = alStack_1c0 + 0x11;
      plVar30 = alStack_1c0 + 1;
      lVar33 = 0;
      do {
        lVar38 = (&s_samplePos4)[lVar33 * 2];
        lVar39 = (&DAT_009e58e8)[lVar33 * 2];
        lVar32 = 0;
        do {
          lVar20 = local_1d8[lVar32] + lVar38;
          lVar29 = local_1f8[lVar32] + lVar39;
          plVar22[lVar32] = lVar6 * lVar29 + lVar5 * lVar20 + lVar7;
          plVar27[lVar32] = lVar9 * lVar29 + lVar8 * lVar20 + lVar10;
          plVar30[lVar32] = lVar29 * lVar12 + lVar20 * lVar11 + lVar13;
          lVar32 = lVar32 + 1;
        } while (lVar32 != 4);
        lVar33 = lVar33 + 1;
        plVar30 = plVar30 + 4;
        plVar27 = plVar27 + 4;
        plVar22 = plVar22 + 4;
      } while (lVar33 != 4);
      uVar40 = (ulong)(this->m_edge01).inclusive;
      lVar32 = -uVar40;
      uVar37 = (ulong)(this->m_edge12).inclusive;
      lVar38 = -uVar37;
      uVar28 = (ulong)(this->m_edge20).inclusive;
      lVar33 = -uVar28;
      lVar39 = 0x18;
      uVar25 = 0;
      uVar34 = 0;
      do {
        lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0xf0U);
        if ((lVar20 == lVar32 || SBORROW8(lVar20,lVar32) != (long)(lVar20 + uVar40) < 0) ||
           (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x70U),
           lVar20 == lVar38 || SBORROW8(lVar20,lVar38) != (long)(lVar20 + uVar37) < 0)) {
          uVar35 = uVar34 & ~(1L << (uVar25 & 0x3f));
        }
        else {
          lVar20 = *(long *)((long)local_1d8 + lVar39 + 8);
          uVar35 = uVar34 & ~(1L << (uVar25 & 0x3f));
          if (lVar20 != lVar33 && SBORROW8(lVar20,lVar33) == (long)(lVar20 + uVar28) < 0) {
            uVar35 = uVar34 | 1L << (uVar25 & 0x3f);
          }
        }
        bVar23 = (byte)uVar25;
        if (((iVar26 == iVar18) ||
            (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0xf8U),
            lVar20 == lVar32 || SBORROW8(lVar20,lVar32) != (long)(lVar20 + uVar40) < 0)) ||
           (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x78U),
           lVar20 == lVar38 || SBORROW8(lVar20,lVar38) != (long)(lVar20 + uVar37) < 0)) {
          uVar34 = uVar35 & ~(0x100L << (bVar23 & 0x3f));
        }
        else {
          uVar21 = 0x100L << (bVar23 & 0x3f);
          lVar20 = *(long *)((long)&local_1c8 + lVar39);
          uVar34 = ~uVar21 & uVar35;
          if (lVar20 != lVar33 && SBORROW8(lVar20,lVar33) == (long)(lVar20 + uVar28) < 0) {
            uVar34 = uVar35 | uVar21;
          }
        }
        if (((iVar24 == iVar19) ||
            (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x100U),
            lVar20 == lVar32 || SBORROW8(lVar20,lVar32) != (long)(lVar20 + uVar40) < 0)) ||
           (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x80U),
           lVar20 == lVar38 || SBORROW8(lVar20,lVar38) != (long)(lVar20 + uVar37) < 0)) {
          uVar35 = uVar34 & ~(0x10L << (bVar23 & 0x3f));
        }
        else {
          uVar21 = 0x10L << (bVar23 & 0x3f);
          lVar20 = *(long *)((long)alStack_1c0 + lVar39);
          uVar35 = ~uVar21 & uVar34;
          if (lVar20 != lVar33 && SBORROW8(lVar20,lVar33) == (long)(lVar20 + uVar28) < 0) {
            uVar35 = uVar34 | uVar21;
          }
        }
        if (((iVar24 == iVar19 || iVar26 == iVar18) ||
            (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x108U),
            lVar20 == lVar32 || SBORROW8(lVar20,lVar32) != (long)(lVar20 + uVar40) < 0)) ||
           (lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 0x88U),
           lVar20 == lVar38 || SBORROW8(lVar20,lVar38) != (long)(lVar20 + uVar37) < 0)) {
          uVar34 = uVar35 & ~(0x1000L << (bVar23 & 0x3f));
        }
        else {
          uVar21 = 0x1000L << (bVar23 & 0x3f);
          lVar20 = *(long *)((long)alStack_1c0 + lVar39 + 8U);
          uVar34 = ~uVar21 & uVar35;
          if (lVar20 != lVar33 && SBORROW8(lVar20,lVar33) == (long)(lVar20 + uVar28) < 0) {
            uVar34 = uVar35 | uVar21;
          }
        }
        uVar25 = uVar25 + 1;
        lVar39 = lVar39 + 0x20;
      } while (uVar25 != 4);
      (this->m_curPos).m_data[0] = iVar4 + 2;
      iVar18 = iVar3;
      if ((this->m_bboxMax).m_data[0] < iVar4 + 2) {
        iVar18 = iVar3 + 2;
        (this->m_curPos).m_data[1] = iVar18;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if (uVar34 != 0) {
        if (depthValues != (float *)0x0) {
          plVar22 = alStack_1c0 + 1;
          plVar27 = alStack_1c0 + 0x11;
          plVar30 = alStack_1c0 + 0x21;
          lVar33 = 0;
          do {
            local_2a8[0] = 0.0;
            local_2a8[1] = 0.0;
            local_2a8[2] = 0.0;
            local_2a8[3] = 0.0;
            lVar38 = 0;
            do {
              *(ulong *)(local_2a8 + lVar38) =
                   CONCAT44((float)plVar30[lVar38 + 1],(float)plVar30[lVar38]);
              lVar38 = lVar38 + 2;
            } while (lVar38 != 4);
            local_2b8._0_4_ = 0.0;
            local_2b8._4_4_ = 0.0;
            fStack_2b0 = 0.0;
            fStack_2ac = 0.0;
            lVar38 = 0;
            do {
              *(ulong *)((long)&local_2b8 + lVar38 * 4) =
                   CONCAT44((float)plVar27[lVar38 + 1],(float)plVar27[lVar38]);
              lVar38 = lVar38 + 2;
            } while (lVar38 != 4);
            local_2c8[0] = 0.0;
            local_2c8[1] = 0.0;
            local_2c8[2] = 0.0;
            local_2c8[3] = 0.0;
            lVar38 = 0;
            do {
              *(ulong *)(local_2c8 + lVar38) =
                   CONCAT44((float)plVar22[lVar38 + 1],(float)plVar22[lVar38]);
              lVar38 = lVar38 + 2;
            } while (lVar38 != 4);
            auVar17._4_4_ = local_2b8._4_4_;
            auVar17._0_4_ = (float)local_2b8;
            auVar17._8_4_ = fStack_2b0;
            auVar17._12_4_ = fStack_2ac;
            auVar16._4_4_ = local_2c8[1];
            auVar16._0_4_ = local_2c8[0];
            auVar16._8_4_ = local_2c8[2];
            auVar16._12_4_ = local_2c8[3];
            local_2c8[0] = local_2a8[0] + (float)local_2b8 + local_2c8[0];
            local_2c8[1] = local_2a8[1] + local_2b8._4_4_ + local_2c8[1];
            local_2c8[2] = local_2a8[2] + fStack_2b0 + local_2c8[2];
            local_2c8[3] = local_2a8[3] + fStack_2ac + local_2c8[3];
            auVar43._4_4_ = local_2c8[1];
            auVar43._0_4_ = local_2c8[0];
            auVar43._8_4_ = local_2c8[2];
            auVar43._12_4_ = local_2c8[3];
            auVar43 = divps(auVar17,auVar43);
            auVar45._4_4_ = local_2c8[1];
            auVar45._0_4_ = local_2c8[0];
            auVar45._8_4_ = local_2c8[2];
            auVar45._12_4_ = local_2c8[3];
            auVar45 = divps(auVar16,auVar45);
            lVar38 = lVar33 + (iVar36 << 4);
            depthValues[lVar38] = auVar43._0_4_ * fVar41 + fVar42 * auVar45._0_4_ + fVar2;
            depthValues[lVar38 + 4] = auVar43._4_4_ * fVar41 + auVar45._4_4_ * fVar42 + fVar2;
            depthValues[lVar38 + 8] = auVar43._8_4_ * fVar41 + auVar45._8_4_ * fVar42 + fVar2;
            depthValues[lVar38 + 0xc] = auVar43._12_4_ * fVar41 + auVar45._12_4_ * fVar42 + fVar2;
            lVar33 = lVar33 + 1;
            plVar30 = plVar30 + 4;
            plVar27 = plVar27 + 4;
            plVar22 = plVar22 + 4;
          } while (lVar33 != 4);
        }
        local_2a8[0] = 0.0;
        local_2a8[1] = 0.0;
        local_2a8[2] = 0.0;
        local_2a8[3] = 0.0;
        local_2b8._0_4_ = 0.0;
        local_2b8._4_4_ = 0.0;
        fStack_2b0 = 0.0;
        fStack_2ac = 0.0;
        local_2c8[0] = 0.0;
        local_2c8[1] = 0.0;
        local_2c8[2] = 0.0;
        local_2c8[3] = 0.0;
        lVar33 = 0;
        do {
          lVar39 = *(long *)((long)local_1d8 + lVar33 * 2) + 0x80;
          lVar38 = *(long *)((long)local_1f8 + lVar33 * 2) + 0x80;
          *(float *)((long)local_2a8 + lVar33) = (float)(lVar6 * lVar38 + lVar5 * lVar39 + lVar7);
          *(float *)((long)&local_2b8 + lVar33) = (float)(lVar9 * lVar38 + lVar8 * lVar39 + lVar10);
          *(float *)((long)local_2c8 + lVar33) = (float)(lVar38 * lVar12 + lVar39 * lVar11 + lVar13)
          ;
          lVar33 = lVar33 + 4;
        } while (lVar33 != 0x10);
        fVar50 = (this->m_v0).m_data[3];
        auVar44._0_4_ = fVar50 * (float)local_2b8;
        auVar44._4_4_ = fVar50 * local_2b8._4_4_;
        auVar44._8_4_ = fVar50 * fStack_2b0;
        auVar44._12_4_ = fVar50 * fStack_2ac;
        fVar50 = (this->m_v1).m_data[3];
        auVar46._0_4_ = fVar50 * local_2c8[0];
        auVar46._4_4_ = fVar50 * local_2c8[1];
        auVar46._8_4_ = fVar50 * local_2c8[2];
        auVar46._12_4_ = fVar50 * local_2c8[3];
        fVar50 = (this->m_v2).m_data[3];
        fVar47 = auVar44._0_4_ + auVar46._0_4_ + fVar50 * local_2a8[0];
        fVar48 = auVar44._4_4_ + auVar46._4_4_ + fVar50 * local_2a8[1];
        fVar49 = auVar44._8_4_ + auVar46._8_4_ + fVar50 * local_2a8[2];
        fVar50 = auVar44._12_4_ + auVar46._12_4_ + fVar50 * local_2a8[3];
        *(ulong *)fragmentPackets[iVar36].position.m_data = CONCAT44(iVar3,iVar4);
        fragmentPackets[iVar36].coverage = uVar34;
        auVar14._4_4_ = fVar48;
        auVar14._0_4_ = fVar47;
        auVar14._8_4_ = fVar49;
        auVar14._12_4_ = fVar50;
        auVar43 = divps(auVar44,auVar14);
        *(undefined1 (*) [16])fragmentPackets[iVar36].barycentric[0].m_data = auVar43;
        auVar15._4_4_ = fVar48;
        auVar15._0_4_ = fVar47;
        auVar15._8_4_ = fVar49;
        auVar15._12_4_ = fVar50;
        auVar45 = divps(auVar46,auVar15);
        *(undefined1 (*) [16])fragmentPackets[iVar36].barycentric[1].m_data = auVar45;
        pVVar1 = fragmentPackets[iVar36].barycentric + 2;
        pVVar1->m_data[0] = (1.0 - auVar43._0_4_) - auVar45._0_4_;
        pVVar1->m_data[1] = (1.0 - auVar43._4_4_) - auVar45._4_4_;
        pVVar1->m_data[2] = (1.0 - auVar43._8_4_) - auVar45._8_4_;
        pVVar1->m_data[3] = (1.0 - auVar43._12_4_) - auVar45._12_4_;
        iVar36 = iVar36 + 1;
        iVar31 = (this->m_bboxMax).m_data[1];
        iVar18 = (this->m_curPos).m_data[1];
      }
    } while ((iVar18 <= iVar31) && (iVar3 = iVar18, iVar36 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar36;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}